

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O3

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setLevelSetUniforms
          (VolumeMeshVertexScalarQuantity *this,ShaderProgram *p)

{
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"u_sliceVector","");
  (*p->_vptr_ShaderProgram[9])(SUB648(ZEXT464(0x3f800000),0),0,p,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"u_slicePoint","");
  (*p->_vptr_ShaderProgram[5])((ulong)(uint)this->levelSetValue,p,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setLevelSetUniforms(render::ShaderProgram& p) {
  p.setUniform("u_sliceVector", glm::vec3(1, 0, 0));
  p.setUniform("u_slicePoint", levelSetValue);
}